

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_wrapper.h
# Opt level: O1

double L18_4::use_f<double,std::function<double(double)>>(double v,function<double_(double)> *f)

{
  char cVar1;
  ostream *poVar2;
  undefined8 *puVar3;
  ulong uVar4;
  double dVar5;
  double local_20;
  
  use_f<double,_std::function<double_(double)>_>::count =
       use_f<double,_std::function<double_(double)>_>::count + 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," use_f count = ",0xf);
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (&std::cout,use_f<double,_std::function<double_(double)>_>::count);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", &count = ",0xb);
  poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
  cVar1 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  uVar4 = (ulong)(uint)(int)cVar1;
  puVar3 = (undefined8 *)std::ostream::put((char)poVar2);
  std::ostream::flush();
  local_20 = v;
  if ((f->super__Function_base)._M_manager != (_Manager_type)0x0) {
    dVar5 = (*f->_M_invoker)((_Any_data *)f,&local_20);
    return dVar5;
  }
  std::__throw_bad_function_call();
  dVar5 = 0.0;
  puVar3[2] = 0;
  puVar3[3] = 0;
  *puVar3 = 0;
  puVar3[1] = 0;
  if (*(code **)(uVar4 + 0x10) != (code *)0x0) {
    dVar5 = (double)(**(code **)(uVar4 + 0x10))();
    puVar3[3] = *(undefined8 *)(uVar4 + 0x18);
    puVar3[2] = *(undefined8 *)(uVar4 + 0x10);
  }
  return dVar5;
}

Assistant:

T use_f(T v, F f) {
        static int count = 0;
        count ++;
        std::cout << " use_f count = " << count << ", &count = " << &count << std::endl;
        return f(v);
    }